

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O3

void adjust_exif_parameters(JOCTET *data,uint length,JDIMENSION new_width,JDIMENSION new_height)

{
  JOCTET *pJVar1;
  bool bVar2;
  ushort uVar3;
  bool bVar4;
  ulong uVar5;
  undefined2 uVar6;
  ulong uVar7;
  uint uVar8;
  ushort uVar9;
  JOCTET JVar10;
  uint uVar11;
  
  if (length < 0xc) {
    return;
  }
  if (*data == 'M') {
    if (data[1] != 'M') {
      return;
    }
    if (data[2] != '\0') {
      return;
    }
    if (data[3] != '*') {
      return;
    }
    if (data[4] != '\0') {
      return;
    }
    if (data[5] != '\0') {
      return;
    }
    uVar9 = *(ushort *)(data + 6) << 8 | *(ushort *)(data + 6) >> 8;
    if (length - 2 < (uint)uVar9) {
      return;
    }
    uVar5 = (ulong)(uint)uVar9;
    uVar7 = uVar5 + 1;
    bVar4 = false;
  }
  else {
    if ((((*data != 'I') || (data[1] != 'I')) || (data[3] != '\0')) ||
       (((data[2] != '*' || (data[7] != '\0')) || (data[6] != '\0')))) {
      return;
    }
    uVar9 = *(ushort *)(data + 4);
    if (length - 2 < (uint)uVar9) {
      return;
    }
    uVar7 = (ulong)(uint)uVar9;
    uVar5 = uVar7 + 1;
    bVar4 = true;
  }
  if (CONCAT11(data[uVar5],data[uVar7]) == 0) {
    return;
  }
  uVar8 = length - 0xc;
  if (uVar8 < uVar9 + 2) {
    return;
  }
  uVar11 = (uint)CONCAT11(data[uVar5],data[uVar7]);
  uVar7 = (ulong)(uint)uVar9 + 0xe;
  do {
    uVar11 = uVar11 - 1;
    if (bVar4) {
      if (*(short *)(data + (uVar7 - 0xc)) == -0x7897) {
        if (data[uVar7 - 1] != '\0') {
          return;
        }
        if (data[uVar7 - 2] != '\0') {
          return;
        }
        uVar9 = *(ushort *)(data + (uVar7 - 4));
        if (length - 2 < (uint)uVar9) {
          return;
        }
        uVar7 = (ulong)(uint)uVar9;
        uVar5 = uVar7 + 1;
LAB_00105212:
        uVar11 = (uint)CONCAT11(data[uVar5],data[uVar7]);
        if (uVar11 < 2) {
          return;
        }
        uVar7 = (ulong)uVar9 + 2;
        break;
      }
    }
    else if ((ushort)(*(ushort *)(data + (uVar7 - 0xc)) << 8 |
                     *(ushort *)(data + (uVar7 - 0xc)) >> 8) == 0x8769) {
      if (data[uVar7 - 4] != '\0') {
        return;
      }
      if (data[uVar7 - 3] != '\0') {
        return;
      }
      uVar9 = *(ushort *)(data + (uVar7 - 2)) << 8 | *(ushort *)(data + (uVar7 - 2)) >> 8;
      if (length - 2 < (uint)uVar9) {
        return;
      }
      uVar5 = (ulong)(uint)uVar9;
      uVar7 = uVar5 + 1;
      goto LAB_00105212;
    }
    if (uVar11 == 0) {
      return;
    }
    bVar2 = uVar8 < uVar7;
    uVar7 = uVar7 + 0xc;
    if (bVar2) {
      return;
    }
  } while( true );
LAB_0010523c:
  if (uVar8 < uVar7) {
    return;
  }
  if (bVar4) {
    if ((*(ushort *)(data + uVar7) & 0xfffe) == 0xa002) {
      uVar6 = (short)new_height;
      if (*(ushort *)(data + uVar7) == 0xa002) {
        uVar6 = (short)new_width;
      }
      pJVar1 = data + uVar7 + 2;
      pJVar1[0] = '\x04';
      pJVar1[1] = '\0';
      pJVar1[2] = '\x01';
      pJVar1[3] = '\0';
      (data + uVar7 + 6)[0] = '\0';
      (data + uVar7 + 6)[1] = '\0';
      data[uVar7 + 8] = (JOCTET)uVar6;
      data[uVar7 + 9] = (JOCTET)((ushort)uVar6 >> 8);
      data[uVar7 + 10] = '\0';
      JVar10 = '\0';
LAB_001052c1:
      data[uVar7 + 0xb] = JVar10;
    }
  }
  else {
    uVar9 = *(ushort *)(data + uVar7) << 8;
    uVar3 = *(ushort *)(data + uVar7) >> 8;
    if ((uVar9 | uVar3 & 0xfffe) == 0xa002) {
      uVar6 = (short)new_height;
      if ((uVar9 | uVar3) == 0xa002) {
        uVar6 = (short)new_width;
      }
      pJVar1 = data + uVar7 + 2;
      pJVar1[0] = '\0';
      pJVar1[1] = '\x04';
      pJVar1[2] = '\0';
      pJVar1[3] = '\0';
      pJVar1[4] = '\0';
      pJVar1[5] = '\x01';
      pJVar1[6] = '\0';
      pJVar1[7] = '\0';
      JVar10 = (JOCTET)uVar6;
      data[uVar7 + 10] = (JOCTET)((ushort)uVar6 >> 8);
      goto LAB_001052c1;
    }
  }
  uVar7 = uVar7 + 0xc;
  uVar11 = uVar11 - 1;
  if (uVar11 == 0) {
    return;
  }
  goto LAB_0010523c;
}

Assistant:

LOCAL(void)
adjust_exif_parameters(JOCTET *data, unsigned int length, JDIMENSION new_width,
                       JDIMENSION new_height)
{
  boolean is_motorola; /* Flag for byte order */
  unsigned int number_of_tags, tagnum;
  unsigned int firstoffset, offset;
  JDIMENSION new_value;

  if (length < 12) return; /* Length of an IFD entry */

  /* Discover byte order */
  if (data[0] == 0x49 && data[1] == 0x49)
    is_motorola = FALSE;
  else if (data[0] == 0x4D && data[1] == 0x4D)
    is_motorola = TRUE;
  else
    return;

  /* Check Tag Mark */
  if (is_motorola) {
    if (data[2] != 0) return;
    if (data[3] != 0x2A) return;
  } else {
    if (data[3] != 0) return;
    if (data[2] != 0x2A) return;
  }

  /* Get first IFD offset (offset to IFD0) */
  if (is_motorola) {
    if (data[4] != 0) return;
    if (data[5] != 0) return;
    firstoffset = data[6];
    firstoffset <<= 8;
    firstoffset += data[7];
  } else {
    if (data[7] != 0) return;
    if (data[6] != 0) return;
    firstoffset = data[5];
    firstoffset <<= 8;
    firstoffset += data[4];
  }
  if (firstoffset > length - 2) return; /* check end of data segment */

  /* Get the number of directory entries contained in this IFD */
  if (is_motorola) {
    number_of_tags = data[firstoffset];
    number_of_tags <<= 8;
    number_of_tags += data[firstoffset + 1];
  } else {
    number_of_tags = data[firstoffset + 1];
    number_of_tags <<= 8;
    number_of_tags += data[firstoffset];
  }
  if (number_of_tags == 0) return;
  firstoffset += 2;

  /* Search for ExifSubIFD offset Tag in IFD0 */
  for (;;) {
    if (firstoffset > length - 12) return; /* check end of data segment */
    /* Get Tag number */
    if (is_motorola) {
      tagnum = data[firstoffset];
      tagnum <<= 8;
      tagnum += data[firstoffset + 1];
    } else {
      tagnum = data[firstoffset + 1];
      tagnum <<= 8;
      tagnum += data[firstoffset];
    }
    if (tagnum == 0x8769) break; /* found ExifSubIFD offset Tag */
    if (--number_of_tags == 0) return;
    firstoffset += 12;
  }

  /* Get the ExifSubIFD offset */
  if (is_motorola) {
    if (data[firstoffset + 8] != 0) return;
    if (data[firstoffset + 9] != 0) return;
    offset = data[firstoffset + 10];
    offset <<= 8;
    offset += data[firstoffset + 11];
  } else {
    if (data[firstoffset + 11] != 0) return;
    if (data[firstoffset + 10] != 0) return;
    offset = data[firstoffset + 9];
    offset <<= 8;
    offset += data[firstoffset + 8];
  }
  if (offset > length - 2) return; /* check end of data segment */

  /* Get the number of directory entries contained in this SubIFD */
  if (is_motorola) {
    number_of_tags = data[offset];
    number_of_tags <<= 8;
    number_of_tags += data[offset + 1];
  } else {
    number_of_tags = data[offset + 1];
    number_of_tags <<= 8;
    number_of_tags += data[offset];
  }
  if (number_of_tags < 2) return;
  offset += 2;

  /* Search for ExifImageWidth and ExifImageHeight Tags in this SubIFD */
  do {
    if (offset > length - 12) return; /* check end of data segment */
    /* Get Tag number */
    if (is_motorola) {
      tagnum = data[offset];
      tagnum <<= 8;
      tagnum += data[offset + 1];
    } else {
      tagnum = data[offset + 1];
      tagnum <<= 8;
      tagnum += data[offset];
    }
    if (tagnum == 0xA002 || tagnum == 0xA003) {
      if (tagnum == 0xA002)
        new_value = new_width; /* ExifImageWidth Tag */
      else
        new_value = new_height; /* ExifImageHeight Tag */
      if (is_motorola) {
        data[offset + 2] = 0; /* Format = unsigned long (4 octets) */
        data[offset + 3] = 4;
        data[offset + 4] = 0; /* Number Of Components = 1 */
        data[offset + 5] = 0;
        data[offset + 6] = 0;
        data[offset + 7] = 1;
        data[offset + 8] = 0;
        data[offset + 9] = 0;
        data[offset + 10] = (JOCTET)((new_value >> 8) & 0xFF);
        data[offset + 11] = (JOCTET)(new_value & 0xFF);
      } else {
        data[offset + 2] = 4; /* Format = unsigned long (4 octets) */
        data[offset + 3] = 0;
        data[offset + 4] = 1; /* Number Of Components = 1 */
        data[offset + 5] = 0;
        data[offset + 6] = 0;
        data[offset + 7] = 0;
        data[offset + 8] = (JOCTET)(new_value & 0xFF);
        data[offset + 9] = (JOCTET)((new_value >> 8) & 0xFF);
        data[offset + 10] = 0;
        data[offset + 11] = 0;
      }
    }
    offset += 12;
  } while (--number_of_tags);
}